

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O0

mraa_result_t mraa_intel_edison_miniboard(mraa_board_t *b)

{
  mraa_pininfo_t *pmVar1;
  mraa_adv_func_t *pmVar2;
  char *pcVar3;
  int local_100;
  mraa_pincapabilities_t local_fc;
  int ici;
  mraa_pincapabilities_t local_f4;
  mraa_pincapabilities_t local_f0;
  mraa_pincapabilities_t local_ec;
  mraa_pincapabilities_t local_e8;
  mraa_pincapabilities_t local_e4;
  mraa_pincapabilities_t local_e0;
  mraa_pincapabilities_t local_dc;
  mraa_pincapabilities_t local_d8;
  mraa_pincapabilities_t local_d4;
  mraa_pincapabilities_t local_d0;
  mraa_pincapabilities_t local_cc;
  mraa_pincapabilities_t local_c8;
  mraa_pincapabilities_t local_c4;
  mraa_pincapabilities_t local_c0;
  mraa_pincapabilities_t local_bc;
  mraa_pincapabilities_t local_b8;
  mraa_pincapabilities_t local_b4;
  mraa_pincapabilities_t local_b0;
  mraa_pincapabilities_t local_ac;
  mraa_pincapabilities_t local_a8;
  mraa_pincapabilities_t local_a4;
  mraa_pincapabilities_t local_a0;
  mraa_pincapabilities_t local_9c;
  mraa_pincapabilities_t local_98;
  mraa_pincapabilities_t local_94;
  mraa_pincapabilities_t local_90;
  mraa_pincapabilities_t local_8c;
  mraa_pincapabilities_t local_88;
  mraa_pincapabilities_t local_84;
  mraa_pincapabilities_t local_80;
  mraa_pincapabilities_t local_7c;
  mraa_pincapabilities_t local_78;
  mraa_pincapabilities_t local_74;
  mraa_pincapabilities_t local_70;
  mraa_pincapabilities_t local_6c;
  mraa_pincapabilities_t local_68;
  mraa_pincapabilities_t local_64;
  mraa_pincapabilities_t local_60;
  mraa_pincapabilities_t local_5c;
  mraa_pincapabilities_t local_58;
  mraa_pincapabilities_t local_54;
  mraa_pincapabilities_t local_50;
  mraa_pincapabilities_t local_4c;
  mraa_pincapabilities_t local_48;
  mraa_pincapabilities_t local_44;
  mraa_pincapabilities_t local_40;
  mraa_pincapabilities_t local_3c;
  mraa_pincapabilities_t local_38;
  mraa_pincapabilities_t local_34;
  mraa_pincapabilities_t local_30;
  mraa_pincapabilities_t local_2c;
  mraa_pincapabilities_t local_28;
  mraa_pincapabilities_t local_24;
  mraa_pincapabilities_t local_20;
  int pos;
  mraa_board_t *b_local;
  
  miniboard = 1;
  b->phy_pin_count = 0x38;
  b->gpio_count = 0x38;
  b->aio_count = 0;
  b->pwm_default_period = 5000;
  b->pwm_max_period = 0x35555;
  b->pwm_min_period = 1;
  pmVar1 = (mraa_pininfo_t *)calloc((long)b->phy_pin_count,0x2f4);
  b->pins = pmVar1;
  if (b->pins == (mraa_pininfo_t *)0x0) {
    b_local._4_4_ = MRAA_ERROR_UNSPECIFIED;
  }
  else {
    pmVar2 = (mraa_adv_func_t *)calloc(1,0x288);
    b->adv_func = pmVar2;
    if (b->adv_func == (mraa_adv_func_t *)0x0) {
      free(b->pins);
      b_local._4_4_ = MRAA_ERROR_UNSPECIFIED;
    }
    else {
      b->adv_func->gpio_init_post = mraa_intel_edison_gpio_init_post;
      b->adv_func->pwm_init_pre = mraa_intel_edison_pwm_init_pre;
      b->adv_func->pwm_enable_pre = mraa_intel_edison_pwm_enable_pre;
      b->adv_func->pwm_write_pre = mraa_intel_edison_pwm_write_pre;
      b->adv_func->i2c_init_pre = mraa_intel_edison_i2c_init_pre;
      b->adv_func->i2c_set_frequency_replace = mraa_intel_edison_i2c_freq;
      b->adv_func->spi_init_pre = mraa_intel_edison_spi_init_pre;
      b->adv_func->gpio_mode_replace = mraa_intel_edison_mb_gpio_mode;
      b->adv_func->uart_init_pre = mraa_intel_edison_uart_init_pre;
      b->adv_func->gpio_mmap_setup = mraa_intel_edison_mmap_setup;
      strncpy(b->pins->name,"J17-1",8);
      local_20 = (mraa_pincapabilities_t)(CONCAT31(local_20._1_3_,3) | 4);
      b->pins->capabilities = local_20;
      (b->pins->gpio).pinmap = 0xb6;
      (b->pins->gpio).mux_total = 0;
      (b->pins->pwm).pinmap = 2;
      (b->pins->pwm).parent_id = 0;
      (b->pins->pwm).mux_total = 0;
      strncpy(b->pins[1].name,"J17-2",8);
      local_24._0_1_ = 1;
      b->pins[1].capabilities = local_24;
      strncpy(b->pins[2].name,"J17-3",8);
      local_28._0_1_ = 1;
      b->pins[2].capabilities = local_28;
      strncpy(b->pins[3].name,"J17-4",8);
      local_2c._0_1_ = 1;
      b->pins[3].capabilities = local_2c;
      strncpy(b->pins[4].name,"J17-5",8);
      local_30._0_1_ = 3;
      b->pins[4].capabilities = local_30;
      b->pins[4].gpio.pinmap = 0x87;
      b->pins[4].gpio.mux_total = 0;
      strncpy(b->pins[5].name,"J17-6",8);
      local_34._0_1_ = 1;
      b->pins[5].capabilities = local_34;
      strncpy(b->pins[6].name,"J17-7",8);
      local_38 = (mraa_pincapabilities_t)(CONCAT31(local_38._1_3_,3) | 0x20);
      b->pins[6].capabilities = local_38;
      b->pins[6].gpio.pinmap = 0x1b;
      b->pins[6].gpio.mux_total = 0;
      b->pins[6].i2c.pinmap = 1;
      b->pins[6].i2c.mux_total = 0;
      strncpy(b->pins[7].name,"J17-8",8);
      local_3c = (mraa_pincapabilities_t)(CONCAT31(local_3c._1_3_,3) | 0x20);
      b->pins[7].capabilities = local_3c;
      b->pins[7].gpio.pinmap = 0x14;
      b->pins[7].gpio.mux_total = 0;
      b->pins[7].i2c.pinmap = 1;
      b->pins[7].i2c.mux_total = 0;
      strncpy(b->pins[8].name,"J17-9",8);
      local_40 = (mraa_pincapabilities_t)(CONCAT31(local_40._1_3_,3) | 0x20);
      b->pins[8].capabilities = local_40;
      b->pins[8].gpio.pinmap = 0x1c;
      b->pins[8].gpio.mux_total = 0;
      b->pins[8].i2c.pinmap = 1;
      b->pins[8].i2c.mux_total = 0;
      strncpy(b->pins[9].name,"J17-10",8);
      local_44 = (mraa_pincapabilities_t)(CONCAT31(local_44._1_3_,3) | 0x10);
      b->pins[9].capabilities = local_44;
      b->pins[9].gpio.pinmap = 0x6f;
      b->pins[9].gpio.mux_total = 0;
      b->pins[9].spi.pinmap = 5;
      b->pins[9].spi.mux_total = 0;
      strncpy(b->pins[10].name,"J17-11",8);
      local_48 = (mraa_pincapabilities_t)(CONCAT31(local_48._1_3_,3) | 0x10);
      b->pins[10].capabilities = local_48;
      b->pins[10].gpio.pinmap = 0x6d;
      b->pins[10].gpio.mux_total = 0;
      b->pins[10].spi.pinmap = 5;
      b->pins[10].spi.mux_total = 0;
      strncpy(b->pins[0xb].name,"J17-12",8);
      local_4c = (mraa_pincapabilities_t)(CONCAT31(local_4c._1_3_,3) | 0x10);
      b->pins[0xb].capabilities = local_4c;
      b->pins[0xb].gpio.pinmap = 0x73;
      b->pins[0xb].gpio.mux_total = 0;
      b->pins[0xb].spi.pinmap = 5;
      b->pins[0xb].spi.mux_total = 0;
      strncpy(b->pins[0xc].name,"J17-13",8);
      local_50._0_1_ = 1;
      b->pins[0xc].capabilities = local_50;
      strncpy(b->pins[0xd].name,"J17-14",8);
      local_54._0_1_ = 3;
      b->pins[0xd].capabilities = local_54;
      b->pins[0xd].gpio.pinmap = 0x80;
      b->pins[0xd].gpio.parent_id = 0;
      b->pins[0xd].gpio.mux_total = 0;
      strncpy(b->pins[0xe].name,"J18-1",8);
      local_58 = (mraa_pincapabilities_t)(CONCAT31(local_58._1_3_,3) | 4);
      b->pins[0xe].capabilities = local_58;
      b->pins[0xe].gpio.pinmap = 0xd;
      b->pins[0xe].gpio.mux_total = 0;
      b->pins[0xe].pwm.pinmap = 1;
      b->pins[0xe].pwm.parent_id = 0;
      b->pins[0xe].pwm.mux_total = 0;
      strncpy(b->pins[0xf].name,"J18-2",8);
      local_5c._0_1_ = 3;
      b->pins[0xf].capabilities = local_5c;
      b->pins[0xf].gpio.pinmap = 0xa5;
      b->pins[0xf].gpio.mux_total = 0;
      strncpy(b->pins[0x10].name,"J18-3",8);
      local_60._0_1_ = 1;
      b->pins[0x10].capabilities = local_60;
      strncpy(b->pins[0x11].name,"J18-4",8);
      local_64._0_1_ = 1;
      b->pins[0x11].capabilities = local_64;
      strncpy(b->pins[0x12].name,"J18-5",8);
      local_68._0_1_ = 1;
      b->pins[0x12].capabilities = local_68;
      strncpy(b->pins[0x13].name,"J18-6",8);
      local_6c = (mraa_pincapabilities_t)(CONCAT31(local_6c._1_3_,3) | 0x20);
      b->pins[0x13].capabilities = local_6c;
      b->pins[0x13].gpio.pinmap = 0x13;
      b->pins[0x13].gpio.mux_total = 0;
      b->pins[0x13].i2c.pinmap = 1;
      b->pins[0x13].i2c.mux_total = 0;
      strncpy(b->pins[0x14].name,"J18-7",8);
      local_70 = (mraa_pincapabilities_t)(CONCAT31(local_70._1_3_,3) | 4);
      b->pins[0x14].capabilities = local_70;
      b->pins[0x14].gpio.pinmap = 0xc;
      b->pins[0x14].gpio.mux_total = 0;
      b->pins[0x14].pwm.pinmap = 0;
      b->pins[0x14].pwm.parent_id = 0;
      b->pins[0x14].pwm.mux_total = 0;
      strncpy(b->pins[0x15].name,"J18-8",8);
      local_74 = (mraa_pincapabilities_t)(CONCAT31(local_74._1_3_,3) | 4);
      b->pins[0x15].capabilities = local_74;
      b->pins[0x15].gpio.pinmap = 0xb7;
      b->pins[0x15].gpio.mux_total = 0;
      b->pins[0x15].pwm.pinmap = 3;
      b->pins[0x15].pwm.parent_id = 0;
      b->pins[0x15].pwm.mux_total = 0;
      strncpy(b->pins[0x16].name,"J18-9",8);
      local_78._0_1_ = 1;
      b->pins[0x16].capabilities = local_78;
      strncpy(b->pins[0x17].name,"J18-10",8);
      local_7c = (mraa_pincapabilities_t)(CONCAT31(local_7c._1_3_,3) | 0x10);
      b->pins[0x17].capabilities = local_7c;
      b->pins[0x17].gpio.pinmap = 0x6e;
      b->pins[0x17].gpio.mux_total = 0;
      b->pins[0x17].spi.pinmap = 5;
      b->pins[0x17].spi.mux_total = 0;
      strncpy(b->pins[0x18].name,"J18-11",8);
      local_80 = (mraa_pincapabilities_t)(CONCAT31(local_80._1_3_,3) | 0x10);
      b->pins[0x18].capabilities = local_80;
      b->pins[0x18].gpio.pinmap = 0x72;
      b->pins[0x18].gpio.mux_total = 0;
      b->pins[0x18].spi.pinmap = 5;
      b->pins[0x18].spi.mux_total = 0;
      strncpy(b->pins[0x19].name,"J18-12",8);
      local_84._0_1_ = 3;
      b->pins[0x19].capabilities = local_84;
      b->pins[0x19].gpio.pinmap = 0x81;
      b->pins[0x19].gpio.mux_total = 0;
      strncpy(b->pins[0x1a].name,"J18-13",8);
      local_88 = (mraa_pincapabilities_t)(CONCAT31(local_88._1_3_,3) | 0x80);
      b->pins[0x1a].capabilities = local_88;
      b->pins[0x1a].gpio.pinmap = 0x82;
      b->pins[0x1a].gpio.mux_total = 0;
      b->pins[0x1a].uart.pinmap = 0;
      b->pins[0x1a].uart.parent_id = 0;
      b->pins[0x1a].uart.mux_total = 0;
      strncpy(b->pins[0x1b].name,"J18-14",8);
      local_8c._0_1_ = 1;
      b->pins[0x1b].capabilities = local_8c;
      strncpy(b->pins[0x1c].name,"J19-1",8);
      local_90._0_1_ = 1;
      b->pins[0x1c].capabilities = local_90;
      strncpy(b->pins[0x1d].name,"J19-2",8);
      local_94._0_1_ = 1;
      b->pins[0x1d].capabilities = local_94;
      strncpy(b->pins[0x1e].name,"J19-3",8);
      local_98._0_1_ = 1;
      b->pins[0x1e].capabilities = local_98;
      strncpy(b->pins[0x1f].name,"J19-4",8);
      local_9c._0_1_ = 3;
      b->pins[0x1f].capabilities = local_9c;
      b->pins[0x1f].gpio.pinmap = 0x2c;
      b->pins[0x1f].gpio.mux_total = 0;
      strncpy(b->pins[0x20].name,"J19-5",8);
      local_a0._0_1_ = 3;
      b->pins[0x20].capabilities = local_a0;
      b->pins[0x20].gpio.pinmap = 0x2e;
      b->pins[0x20].gpio.mux_total = 0;
      strncpy(b->pins[0x21].name,"J19-6",8);
      local_a4._0_1_ = 3;
      b->pins[0x21].capabilities = local_a4;
      b->pins[0x21].gpio.pinmap = 0x30;
      b->pins[0x21].gpio.mux_total = 0;
      strncpy(b->pins[0x22].name,"J19-7",8);
      local_a8._0_1_ = 1;
      b->pins[0x22].capabilities = local_a8;
      strncpy(b->pins[0x23].name,"J19-8",8);
      local_ac = (mraa_pincapabilities_t)(CONCAT31(local_ac._1_3_,3) | 0x80);
      b->pins[0x23].capabilities = local_ac;
      b->pins[0x23].gpio.pinmap = 0x83;
      b->pins[0x23].gpio.mux_total = 0;
      b->pins[0x23].uart.pinmap = 0;
      b->pins[0x23].uart.parent_id = 0;
      b->pins[0x23].uart.mux_total = 0;
      strncpy(b->pins[0x24].name,"J19-9",8);
      local_b0._0_1_ = 3;
      b->pins[0x24].capabilities = local_b0;
      b->pins[0x24].gpio.pinmap = 0xe;
      b->pins[0x24].gpio.mux_total = 0;
      strncpy(b->pins[0x25].name,"J19-10",8);
      local_b4._0_1_ = 3;
      b->pins[0x25].capabilities = local_b4;
      b->pins[0x25].gpio.pinmap = 0x28;
      b->pins[0x25].gpio.mux_total = 0;
      strncpy(b->pins[0x26].name,"J19-11",8);
      local_b8._0_1_ = 3;
      b->pins[0x26].capabilities = local_b8;
      b->pins[0x26].gpio.pinmap = 0x2b;
      b->pins[0x26].gpio.mux_total = 0;
      strncpy(b->pins[0x27].name,"J19-12",8);
      local_bc._0_1_ = 3;
      b->pins[0x27].capabilities = local_bc;
      b->pins[0x27].gpio.pinmap = 0x4d;
      b->pins[0x27].gpio.mux_total = 0;
      strncpy(b->pins[0x28].name,"J19-13",8);
      local_c0._0_1_ = 3;
      b->pins[0x28].capabilities = local_c0;
      b->pins[0x28].gpio.pinmap = 0x52;
      b->pins[0x28].gpio.mux_total = 0;
      strncpy(b->pins[0x29].name,"J19-14",8);
      local_c4._0_1_ = 3;
      b->pins[0x29].capabilities = local_c4;
      b->pins[0x29].gpio.pinmap = 0x53;
      b->pins[0x29].gpio.mux_total = 0;
      strncpy(b->pins[0x2a].name,"J20-1",8);
      local_c8._0_1_ = 1;
      b->pins[0x2a].capabilities = local_c8;
      strncpy(b->pins[0x2b].name,"J20-2",8);
      local_cc._0_1_ = 1;
      b->pins[0x2b].capabilities = local_cc;
      strncpy(b->pins[0x2c].name,"J20-3",8);
      local_d0._0_1_ = 1;
      b->pins[0x2c].capabilities = local_d0;
      strncpy(b->pins[0x2d].name,"J20-4",8);
      local_d4._0_1_ = 3;
      b->pins[0x2d].capabilities = local_d4;
      b->pins[0x2d].gpio.pinmap = 0x2d;
      b->pins[0x2d].gpio.mux_total = 0;
      strncpy(b->pins[0x2e].name,"J20-5",8);
      local_d8._0_1_ = 3;
      b->pins[0x2e].capabilities = local_d8;
      b->pins[0x2e].gpio.pinmap = 0x2f;
      b->pins[0x2e].gpio.mux_total = 0;
      strncpy(b->pins[0x2f].name,"J20-6",8);
      local_dc._0_1_ = 3;
      b->pins[0x2f].capabilities = local_dc;
      b->pins[0x2f].gpio.pinmap = 0x31;
      b->pins[0x2f].gpio.mux_total = 0;
      strncpy(b->pins[0x30].name,"J20-7",8);
      local_e0._0_1_ = 3;
      b->pins[0x30].capabilities = local_e0;
      b->pins[0x30].gpio.pinmap = 0xf;
      b->pins[0x30].gpio.mux_total = 0;
      strncpy(b->pins[0x31].name,"J20-8",8);
      local_e4._0_1_ = 3;
      b->pins[0x31].capabilities = local_e4;
      b->pins[0x31].gpio.pinmap = 0x54;
      b->pins[0x31].gpio.mux_total = 0;
      strncpy(b->pins[0x32].name,"J20-9",8);
      local_e8._0_1_ = 3;
      b->pins[0x32].capabilities = local_e8;
      b->pins[0x32].gpio.pinmap = 0x2a;
      b->pins[0x32].gpio.mux_total = 0;
      strncpy(b->pins[0x33].name,"J20-10",8);
      local_ec._0_1_ = 3;
      b->pins[0x33].capabilities = local_ec;
      b->pins[0x33].gpio.pinmap = 0x29;
      b->pins[0x33].gpio.mux_total = 0;
      strncpy(b->pins[0x34].name,"J20-11",8);
      local_f0._0_1_ = 3;
      b->pins[0x34].capabilities = local_f0;
      b->pins[0x34].gpio.pinmap = 0x4e;
      b->pins[0x34].gpio.mux_total = 0;
      strncpy(b->pins[0x35].name,"J20-12",8);
      local_f4._0_1_ = 3;
      b->pins[0x35].capabilities = local_f4;
      b->pins[0x35].gpio.pinmap = 0x4f;
      b->pins[0x35].gpio.mux_total = 0;
      strncpy(b->pins[0x36].name,"J20-13",8);
      ici = CONCAT31(ici._1_3_,3);
      b->pins[0x36].capabilities = (mraa_pincapabilities_t)ici;
      b->pins[0x36].gpio.pinmap = 0x50;
      b->pins[0x36].gpio.mux_total = 0;
      strncpy(b->pins[0x37].name,"J20-14",8);
      local_fc._0_1_ = 3;
      b->pins[0x37].capabilities = local_fc;
      b->pins[0x37].gpio.pinmap = 0x51;
      b->pins[0x37].gpio.mux_total = 0;
      b->i2c_bus_count = 9;
      b->def_i2c_bus = 1;
      for (local_100 = 0; local_100 < 9; local_100 = local_100 + 1) {
        b->i2c_bus[local_100].bus_id = -1;
      }
      b->i2c_bus[1].bus_id = 1;
      b->i2c_bus[1].sda = 7;
      b->i2c_bus[1].scl = 0x13;
      b->i2c_bus[6].bus_id = 6;
      b->i2c_bus[6].sda = 8;
      b->i2c_bus[6].scl = 6;
      b->spi_bus_count = 1;
      b->def_spi_bus = 0;
      b->spi_bus[0].bus_id = 5;
      b->spi_bus[0].slave_s = 1;
      b->spi_bus[0].cs = 0x17;
      b->spi_bus[0].mosi = 0xb;
      b->spi_bus[0].miso = 0x18;
      b->spi_bus[0].sclk = 10;
      b->uart_dev_count = 1;
      b->def_uart_dev = 0;
      b->uart_dev[0].rx = 0x1a;
      b->uart_dev[0].tx = 0x23;
      pcVar3 = "/dev/ttyS1";
      if (vanilla_kernel == 0) {
        pcVar3 = "/dev/ttyMFD1";
      }
      b->uart_dev[0].device_path = pcVar3;
      b_local._4_4_ = MRAA_SUCCESS;
    }
  }
  return b_local._4_4_;
}

Assistant:

mraa_result_t
mraa_intel_edison_miniboard(mraa_board_t* b)
{
    miniboard = 1;
    b->phy_pin_count = 56;
    b->gpio_count = 56; // A bit of a hack I suppose
    b->aio_count = 0;
    b->pwm_default_period = 5000;
    b->pwm_max_period = 218453;
    b->pwm_min_period = 1;

    b->pins = (mraa_pininfo_t*) calloc(b->phy_pin_count, sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        return MRAA_ERROR_UNSPECIFIED;
    }

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        return MRAA_ERROR_UNSPECIFIED;
    }
    b->adv_func->gpio_init_post = &mraa_intel_edison_gpio_init_post;
    b->adv_func->pwm_init_pre = &mraa_intel_edison_pwm_init_pre;
    b->adv_func->pwm_enable_pre = &mraa_intel_edison_pwm_enable_pre;
    b->adv_func->pwm_write_pre = &mraa_intel_edison_pwm_write_pre;
    b->adv_func->i2c_init_pre = &mraa_intel_edison_i2c_init_pre;
    b->adv_func->i2c_set_frequency_replace = &mraa_intel_edison_i2c_freq;
    b->adv_func->spi_init_pre = &mraa_intel_edison_spi_init_pre;
    b->adv_func->gpio_mode_replace = &mraa_intel_edison_mb_gpio_mode;
    b->adv_func->uart_init_pre = &mraa_intel_edison_uart_init_pre;
    b->adv_func->gpio_mmap_setup = &mraa_intel_edison_mmap_setup;

    int pos = 0;
    strncpy(b->pins[pos].name, "J17-1", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 182;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].pwm.pinmap = 2;
    b->pins[pos].pwm.parent_id = 0;
    b->pins[pos].pwm.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-2", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J17-3", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J17-4", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J17-5", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 135;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-6", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J17-7", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 0, 0 };
    b->pins[pos].gpio.pinmap = 27;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].i2c.pinmap = 1;
    b->pins[pos].i2c.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-8", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 0, 0 };
    b->pins[pos].gpio.pinmap = 20;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].i2c.pinmap = 1;
    b->pins[pos].i2c.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-9", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 0, 0 };
    b->pins[pos].gpio.pinmap = 28;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].i2c.pinmap = 1;
    b->pins[pos].i2c.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-10", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 111;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].spi.pinmap = 5;
    b->pins[pos].spi.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-11", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 109;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].spi.pinmap = 5;
    b->pins[pos].spi.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-12", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 115;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].spi.pinmap = 5;
    b->pins[pos].spi.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J17-13", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J17-14", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 128;
    b->pins[pos].gpio.parent_id = 0;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J18-1", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0 , 0};
    b->pins[pos].gpio.pinmap = 13;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].pwm.pinmap = 1;
    b->pins[pos].pwm.parent_id = 0;
    b->pins[pos].pwm.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J18-2", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 165;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J18-3", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J18-4", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J18-5", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J18-6", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 0, 0 };
    b->pins[pos].gpio.pinmap = 19;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].i2c.pinmap = 1;
    b->pins[pos].i2c.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J18-7", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 12;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].pwm.pinmap = 0;
    b->pins[pos].pwm.parent_id = 0;
    b->pins[pos].pwm.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J18-8", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 183;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].pwm.pinmap = 3;
    b->pins[pos].pwm.parent_id = 0;
    b->pins[pos].pwm.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J18-9", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J18-10", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 110;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].spi.pinmap = 5;
    b->pins[pos].spi.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J18-11", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 114;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].spi.pinmap = 5;
    b->pins[pos].spi.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J18-12", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 129;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J18-13", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 1 };
    b->pins[pos].gpio.pinmap = 130;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].uart.pinmap = 0;
    b->pins[pos].uart.parent_id = 0;
    b->pins[pos].uart.mux_total = 0;

    pos++;
    strncpy(b->pins[pos].name, "J18-14", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J19-1", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J19-2", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J19-3", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J19-4", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 44;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J19-5", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 46;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J19-6", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 48;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J19-7", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J19-8", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 1 };
    b->pins[pos].gpio.pinmap = 131;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].uart.pinmap = 0;
    b->pins[pos].uart.parent_id = 0;
    b->pins[pos].uart.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J19-9", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 14;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J19-10", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 40;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J19-11", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 43;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J19-12", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 77;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J19-13", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 82;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J19-14", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 83;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J20-1", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J20-2", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J20-3", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J20-4", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 45;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-5", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 47;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-6", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 49;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-7", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 15;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-8", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 84;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-9", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 42;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-10", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 41;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-11", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 78;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-12", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 79;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-13", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 80;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-14", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 81;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    // BUS DEFINITIONS
    b->i2c_bus_count = 9;
    b->def_i2c_bus = 1;
    int ici;
    for (ici = 0; ici < 9; ici++) {
        b->i2c_bus[ici].bus_id = -1;
    }
    b->i2c_bus[1].bus_id = 1;
    b->i2c_bus[1].sda = 7;
    b->i2c_bus[1].scl = 19;

    b->i2c_bus[6].bus_id = 6;
    b->i2c_bus[6].sda = 8;
    b->i2c_bus[6].scl = 6;

    b->spi_bus_count = 1;
    b->def_spi_bus = 0;
    b->spi_bus[0].bus_id = 5;
    b->spi_bus[0].slave_s = 1;
    b->spi_bus[0].cs = 23;
    b->spi_bus[0].mosi = 11;
    b->spi_bus[0].miso = 24;
    b->spi_bus[0].sclk = 10;

    b->uart_dev_count = 1;
    b->def_uart_dev = 0;
    b->uart_dev[0].rx = 26;
    b->uart_dev[0].tx = 35;
    b->uart_dev[0].device_path = UART_DEV_PATH;

    return MRAA_SUCCESS;
}